

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O1

UStringTrieResult __thiscall
icu_63::UCharsTrie::next(UCharsTrie *this,ConstChar16Ptr *ptr,int32_t sLength)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char16_t cVar4;
  uint uVar5;
  int iVar6;
  uint uchar;
  int iVar7;
  long lVar8;
  UStringTrieResult in_R8D;
  UStringTrieResult UVar9;
  int iVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  char16_t *pos;
  int32_t iVar13;
  uint length;
  
  pcVar11 = ptr->p_;
  if (sLength < 0) {
    if (*pcVar11 == L'\0') goto LAB_002a6036;
  }
  else if (sLength == 0) {
LAB_002a6036:
    if (this->pos_ == (char16_t *)0x0) {
      return USTRINGTRIE_NO_MATCH;
    }
    if (this->remainingMatchLength_ < 0) {
      cVar4 = *this->pos_;
      if (0x3f < (ushort)cVar4) {
        return (ushort)cVar4 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      }
      return USTRINGTRIE_NO_VALUE;
    }
    return USTRINGTRIE_NO_VALUE;
  }
  pos = this->pos_;
  if (pos == (char16_t *)0x0) {
    return USTRINGTRIE_NO_MATCH;
  }
  iVar13 = this->remainingMatchLength_;
LAB_002a5dbf:
  if (sLength < 0) {
    cVar4 = *pcVar11;
    pcVar11 = pcVar11 + 1;
    if (cVar4 != L'\0') {
      iVar10 = -1;
      if (iVar13 < -1) {
        iVar10 = iVar13;
      }
      do {
        if (iVar13 < 0) goto LAB_002a5eda;
        pcVar12 = pcVar11;
        if (cVar4 != *pos) goto LAB_002a600e;
        pos = pos + 1;
        iVar13 = iVar13 + -1;
        cVar4 = *pcVar11;
        pcVar11 = pcVar11 + 1;
      } while (cVar4 != L'\0');
    }
    this->remainingMatchLength_ = iVar13;
    this->pos_ = pos;
    in_R8D = USTRINGTRIE_NO_VALUE;
    if ((iVar13 < 0) && (0x3f < (ushort)*pos)) {
      in_R8D = (ushort)*pos >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
      bVar2 = false;
    }
    else {
      bVar2 = false;
    }
  }
  else {
    if (sLength != 0) {
      iVar10 = -1;
      if (iVar13 < -1) {
        iVar10 = iVar13;
      }
      iVar6 = iVar13 - sLength;
      iVar7 = 1 - sLength;
      lVar8 = 0;
      do {
        cVar4 = *(char16_t *)((long)pcVar11 + lVar8);
        if (iVar13 < 0) {
          sLength = -iVar7;
          pcVar11 = (char16_t *)((long)pcVar11 + lVar8 + 2);
          pos = (char16_t *)((long)pos + lVar8);
          goto LAB_002a5eda;
        }
        if (cVar4 != *(char16_t *)((long)pos + lVar8)) {
          this->pos_ = (char16_t *)0x0;
          sLength = -iVar7;
          pcVar12 = (char16_t *)((long)pcVar11 + lVar8 + 2);
          pos = (char16_t *)((long)pos + lVar8);
          goto LAB_002a6018;
        }
        iVar13 = iVar13 + -1;
        iVar7 = iVar7 + 1;
        lVar8 = lVar8 + 2;
      } while (iVar7 != 1);
      pcVar11 = (char16_t *)((long)pcVar11 + lVar8);
      pos = (char16_t *)((long)pos + lVar8);
      iVar13 = iVar6;
    }
    this->remainingMatchLength_ = iVar13;
    this->pos_ = pos;
    if ((iVar13 < 0) && (0x3f < (ushort)*pos)) {
      bVar2 = false;
      sLength = 0;
      in_R8D = (ushort)*pos >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
    }
    else {
      bVar2 = false;
      sLength = 0;
      in_R8D = USTRINGTRIE_NO_VALUE;
    }
  }
  goto LAB_002a601b;
LAB_002a5eda:
  iVar13 = iVar10;
  uchar = (uint)(ushort)cVar4;
  this->remainingMatchLength_ = iVar13;
  length = (uint)(ushort)*pos;
  pos = pos + 1;
  pcVar12 = pcVar11;
  UVar9 = in_R8D;
  do {
    uVar5 = length & 0x3f;
    uVar3 = length;
    while (length = uVar3, pcVar11 = pcVar12, 0x2f < length) {
      if (length < 0x40) {
        if (uchar != (ushort)*pos) {
          iVar13 = length - 0x30;
          goto LAB_002a600e;
        }
        pos = pos + 1;
        iVar13 = length - 0x31;
        bVar2 = true;
        in_R8D = UVar9;
        goto LAB_002a601b;
      }
      if ((short)length < 0) {
        this->pos_ = (char16_t *)0x0;
        goto LAB_002a6018;
      }
      uVar3 = uVar5;
      if (0x403f < length) {
        if (length < 0x7fc0) {
          pos = pos + 1;
        }
        else {
          pos = pos + 2;
        }
      }
    }
    in_R8D = branchNext(this,pos,length,uchar);
    if (in_R8D == USTRINGTRIE_NO_MATCH) {
      in_R8D = USTRINGTRIE_NO_MATCH;
LAB_002a5fb5:
      bVar1 = false;
    }
    else {
      if (sLength < 0) {
        cVar4 = *pcVar12;
        pcVar11 = pcVar12 + 1;
        if (cVar4 == L'\0') {
          bVar1 = false;
          uchar = 0;
          goto LAB_002a5fb8;
        }
      }
      else {
        if (sLength == 0) {
          sLength = 0;
          goto LAB_002a5fb5;
        }
        cVar4 = *pcVar12;
        sLength = sLength + -1;
      }
      uchar = (uint)(ushort)cVar4;
      pcVar11 = pcVar12 + 1;
      if (in_R8D == USTRINGTRIE_FINAL_VALUE) {
        this->pos_ = (char16_t *)0x0;
        bVar1 = false;
        in_R8D = USTRINGTRIE_NO_MATCH;
      }
      else {
        length = (uint)(ushort)*this->pos_;
        pos = this->pos_ + 1;
        bVar1 = true;
        in_R8D = UVar9;
      }
    }
LAB_002a5fb8:
    bVar2 = false;
    pcVar12 = pcVar11;
    UVar9 = in_R8D;
  } while (bVar1);
LAB_002a601b:
  if (!bVar2) {
    return in_R8D;
  }
  goto LAB_002a5dbf;
LAB_002a600e:
  this->pos_ = (char16_t *)0x0;
LAB_002a6018:
  bVar2 = false;
  pcVar11 = pcVar12;
  in_R8D = USTRINGTRIE_NO_MATCH;
  goto LAB_002a601b;
}

Assistant:

UStringTrieResult
UCharsTrie::next(ConstChar16Ptr ptr, int32_t sLength) {
    const UChar *s=ptr;
    if(sLength<0 ? *s==0 : sLength==0) {
        // Empty input.
        return current();
    }
    const UChar *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    for(;;) {
        // Fetch the next input unit, if there is one.
        // Continue a linear-match node without rechecking sLength<0.
        int32_t uchar;
        if(sLength<0) {
            for(;;) {
                if((uchar=*s++)==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        } else {
            for(;;) {
                if(sLength==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                uchar=*s++;
                --sLength;
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        }
        int32_t node=*pos++;
        for(;;) {
            if(node<kMinLinearMatch) {
                UStringTrieResult result=branchNext(pos, node, uchar);
                if(result==USTRINGTRIE_NO_MATCH) {
                    return USTRINGTRIE_NO_MATCH;
                }
                // Fetch the next input unit, if there is one.
                if(sLength<0) {
                    if((uchar=*s++)==0) {
                        return result;
                    }
                } else {
                    if(sLength==0) {
                        return result;
                    }
                    uchar=*s++;
                    --sLength;
                }
                if(result==USTRINGTRIE_FINAL_VALUE) {
                    // No further matching units.
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                pos=pos_;  // branchNext() advanced pos and wrote it to pos_ .
                node=*pos++;
            } else if(node<kMinValueLead) {
                // Match length+1 units.
                length=node-kMinLinearMatch;  // Actual match length minus 1.
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
                break;
            } else if(node&kValueIsFinal) {
                // No further matching units.
                stop();
                return USTRINGTRIE_NO_MATCH;
            } else {
                // Skip intermediate value.
                pos=skipNodeValue(pos, node);
                node&=kNodeTypeMask;
            }
        }
    }
}